

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units-test.c++
# Opt level: O3

void __thiscall kj::anon_unknown_0::TestCase290::run(TestCase290 *this)

{
  return;
}

Assistant:

TEST(UnitMeasure, BoundedQuantity) {
  auto BYTES = unit<Quantity<Bounded<12345, uint16_t>, byte>>();

  uint expected = 0;
  for (auto i: zeroTo(bounded<10>() * BYTES)) {
    Quantity<Bounded<10, uint8_t>, byte> value = i;
    KJ_EXPECT(unbound(value / BYTES) == expected++);
  }
  KJ_EXPECT(expected == 10);

  expected = 0;
  for (auto i: zeroTo(bounded((uint8_t)10) * BYTES)) {
    Quantity<Bounded<255, uint8_t>, byte> value = i;
    KJ_EXPECT(unbound(value / BYTES) == expected++);
  }
  KJ_EXPECT(expected == 10);

  expected = 3;
  for (auto i: range(bounded((uint8_t)3) * BYTES, bounded((uint8_t)10) * BYTES)) {
    Quantity<Bounded<255, uint8_t>, byte> value = i;
    KJ_EXPECT(unbound(value / BYTES) == expected++);
  }
  KJ_EXPECT(expected == 10);
}